

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
::
emplace_new_key<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>
          (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>
          *key)

{
  char cVar1;
  uint32_t uVar2;
  pointer pDVar3;
  pointer pDVar4;
  pointer pDVar5;
  EntryPointer psVar6;
  EntryPointer psVar7;
  EntryPointer psVar8;
  BufferID __tmp_1;
  long lVar9;
  pointer pDVar10;
  long lVar11;
  pointer pDVar12;
  pointer pDVar13;
  undefined8 unaff_RBP;
  ulong uVar14;
  uint32_t uVar15;
  char __tmp_2;
  sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
  sVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_bool>
  pVar19;
  pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>
  local_40;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
       )distance_from_desired)) {
    lVar11 = *(long *)(this + 0x18) + 1;
    auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar17._0_8_ = lVar11;
    auVar17._12_4_ = 0x45300000;
    lVar9 = *(long *)(this + 8) + 1;
    auVar18._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar18._0_8_ = lVar9;
    auVar18._12_4_ = 0x45300000;
    if ((auVar17._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar18._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) {
      if (current_entry->distance_from_desired < '\0') {
        (current_entry->field_1).value.first.id = (key->first).id;
        pDVar3 = (key->second).
                 super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (current_entry->field_1).value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (key->second).
             super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (current_entry->field_1).value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar3;
        (current_entry->field_1).value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (key->second).
             super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (key->second).
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (key->second).
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (key->second).
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        uVar2 = (key->first).id;
        pDVar3 = (key->second).
                 super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pDVar4 = (key->second).
                 super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar5 = (key->second).
                 super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (key->second).
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (key->second).
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (key->second).
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cVar1 = current_entry->distance_from_desired;
        current_entry->distance_from_desired = distance_from_desired;
        uVar15 = (current_entry->field_1).value.first.id;
        (current_entry->field_1).value.first.id = uVar2;
        pDVar13 = (current_entry->field_1).value.second.
                  super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pDVar12 = (current_entry->field_1).value.second.
                  super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pDVar10 = (current_entry->field_1).value.second.
                  super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (current_entry->field_1).value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar4;
        (current_entry->field_1).value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar5;
        (current_entry->field_1).value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar3;
        sVar16 = (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
                  )(cVar1 + '\x01');
        cVar1 = current_entry[1].distance_from_desired;
        psVar8 = current_entry + 1;
        psVar7 = current_entry;
        while (psVar6 = psVar8, -1 < cVar1) {
          if (cVar1 < (char)sVar16) {
            psVar6->distance_from_desired = (int8_t)sVar16;
            uVar2 = (psVar6->field_1).value.first.id;
            (psVar6->field_1).value.first.id = uVar15;
            pDVar3 = (psVar6->field_1).value.second.
                     super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pDVar4 = (psVar6->field_1).value.second.
                     super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pDVar5 = (psVar6->field_1).value.second.
                     super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (psVar6->field_1).value.second.
            super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
            ._M_impl.super__Vector_impl_data._M_start = pDVar13;
            (psVar6->field_1).value.second.
            super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
            ._M_impl.super__Vector_impl_data._M_finish = pDVar12;
            (psVar6->field_1).value.second.
            super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar10;
            sVar16 = (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
                      )(cVar1 + '\x01');
            pDVar10 = pDVar5;
            pDVar12 = pDVar4;
            pDVar13 = pDVar3;
            uVar15 = uVar2;
          }
          else {
            sVar16 = (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>>
                      )((char)sVar16 + '\x01');
            if (sVar16 == this[0x11]) {
              local_40.first.id = (current_entry->field_1).value.first.id;
              (current_entry->field_1).value.first.id = uVar15;
              local_40.second.
              super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (current_entry->field_1).value.second.
                   super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_40.second.
              super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (current_entry->field_1).value.second.
                   super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_40.second.
              super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (current_entry->field_1).value.second.
                   super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (current_entry->field_1).value.second.
              super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
              ._M_impl.super__Vector_impl_data._M_start = pDVar13;
              (current_entry->field_1).value.second.
              super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
              ._M_impl.super__Vector_impl_data._M_finish = pDVar12;
              (current_entry->field_1).value.second.
              super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar10;
              sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>
              ::grow((sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>
                      *)this);
              pVar19 = emplace<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>
                                 (this,&local_40);
              current_entry = (EntryPointer)pVar19.first.current;
              uVar14 = (ulong)pVar19._8_4_;
              if (local_40.second.
                  super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_40.second.
                                super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_40.second.
                                      super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_40.second.
                                      super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_0015c9b4;
            }
          }
          psVar8 = psVar6 + 1;
          psVar7 = psVar6;
          cVar1 = psVar6[1].distance_from_desired;
        }
        psVar7[1].field_1.value.first.id = uVar15;
        psVar7[1].field_1.value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar13;
        psVar7[1].field_1.value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar12;
        psVar7[1].field_1.value.second.
        super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar10;
        psVar6->distance_from_desired = (int8_t)sVar16;
      }
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      uVar14 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      goto LAB_0015c9b4;
    }
  }
  sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>
  ::grow((sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>
          *)this);
  pVar19 = emplace<std::pair<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>
                     (this,key);
  current_entry = (EntryPointer)pVar19.first.current;
  uVar14 = (ulong)pVar19._8_4_;
LAB_0015c9b4:
  pVar19._8_8_ = uVar14 & 0xffffffff;
  pVar19.first.current = current_entry;
  return pVar19;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }